

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,double a,int fieldWidth,char format,
                 int precision,QChar fillChar)

{
  QStringView arg;
  QStringView larg;
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  uint uVar4;
  undefined1 *puVar5;
  int iVar6;
  NumberOptions NVar7;
  undefined4 extraout_var;
  QLocalePrivate *pQVar8;
  ushort *puVar9;
  char cVar10;
  uint uVar11;
  DoubleForm form;
  long in_FS_OFFSET;
  bool bVar12;
  QStringView s;
  QStringView s_00;
  QArrayDataPointer<char16_t> local_b8;
  QLocale locale;
  QArrayDataPointer<char16_t> local_98;
  QMessageLogger local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  findArgEscapes((ArgEscapeData *)&local_58,s);
  puVar5 = local_48;
  if (puStack_50 == (undefined1 *)0x0) {
    local_78.context.version = 2;
    local_78.context.function._4_4_ = 0;
    local_78.context.line = 0;
    local_78.context.file._0_4_ = 0;
    local_78.context.file._4_4_ = 0;
    local_78.context.function._0_4_ = 0;
    local_78.context.category = "default";
    puVar9 = utf16(this);
    QMessageLogger::warning
              (&local_78,"QString::arg: Argument missing: \"%ls\", %g",SUB84(a,0),puVar9);
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&this->d);
  }
  else {
    bVar12 = fillChar.ucs == L'0';
    uVar11 = (int)format - 0x41;
    cVar10 = format + ' ';
    uVar4 = bVar12 + 0x40 + (uint)bVar12;
    if (0x19 < uVar11) {
      cVar10 = format;
      uVar4 = (uint)bVar12 * 2;
    }
    form = DFSignificantDigits;
    if (cVar10 != 'g') {
      form = (uint)(cVar10 != 'e');
    }
    local_78.context.function._0_4_ = 0;
    local_78.context.function._4_4_ = 0;
    local_78.context.version = 0;
    local_78.context.line = 0;
    local_78.context.file._0_4_ = 0;
    local_78.context.file._4_4_ = 0;
    if ((long)local_48 < (long)puStack_50) {
      iVar6 = QLocaleData::c((void *)(ulong)uVar11,(void *)(ulong)(uint)(int)format);
      QLocaleData::doubleToString
                ((QString *)&local_98,(QLocaleData *)CONCAT44(extraout_var,iVar6),a,precision,form,
                 fieldWidth,uVar4 + 0x200);
      pDVar1 = (Data *)CONCAT44(local_78.context.line,local_78.context.version);
      pcVar2 = (char16_t *)CONCAT44(local_78.context.file._4_4_,local_78.context.file._0_4_);
      local_78.context.version = (int)local_98.d;
      local_78.context.line = (int)((ulong)local_98.d >> 0x20);
      local_78.context.file._0_4_ = SUB84(local_98.ptr,0);
      local_78.context.file._4_4_ = (undefined4)((ulong)local_98.ptr >> 0x20);
      qVar3 = CONCAT44(local_78.context.function._4_4_,local_78.context.function._0_4_);
      local_78.context.function._0_4_ = (undefined4)local_98.size;
      local_78.context.function._4_4_ = (undefined4)((ulong)local_98.size >> 0x20);
      local_98.d = pDVar1;
      local_98.ptr = pcVar2;
      local_98.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    }
    local_98.d = (Data *)0x0;
    local_98.ptr = (storage_type_conflict *)0x0;
    local_98.size = 0;
    if (0 < (long)puVar5) {
      locale.d.d.ptr = (QSharedDataPointer<QLocalePrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QLocale::QLocale(&locale);
      NVar7 = QLocale::numberOptions(&locale);
      pQVar8 = QSharedDataPointer<QLocalePrivate>::operator->(&locale.d);
      QLocaleData::doubleToString
                ((QString *)&local_b8,pQVar8->m_data,a,precision,form,fieldWidth,
                 ((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                        super_QFlagsStorage<QLocale::NumberOption>.i >> 4 & 1 |
                  ((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 4) << 7 |
                  ((uint)NVar7.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
                         super_QFlagsStorage<QLocale::NumberOption>.i & 1) << 5 | uVar4) ^ 0x220);
      qVar3 = local_98.size;
      pcVar2 = local_98.ptr;
      pDVar1 = local_98.d;
      local_98.d = local_b8.d;
      local_98.ptr = local_b8.ptr;
      local_b8.d = pDVar1;
      local_b8.ptr = pcVar2;
      local_98.size = local_b8.size;
      local_b8.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
      QLocale::~QLocale(&locale);
    }
    arg.m_data._4_4_ = local_78.context.file._4_4_;
    arg.m_data._0_4_ = local_78.context.file._0_4_;
    arg.m_size._4_4_ = local_78.context.function._4_4_;
    arg.m_size._0_4_ = local_78.context.function._0_4_;
    larg.m_data = local_98.ptr;
    larg.m_size = local_98.size;
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_58,(long)fieldWidth,arg,
                      larg,fillChar);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QString::arg_impl(double a, int fieldWidth, char format, int precision, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (d.occurrences == 0) {
        qWarning("QString::arg: Argument missing: \"%ls\", %g", qUtf16Printable(*this), a);
        return *this;
    }

    unsigned flags = QLocaleData::NoFlags;
    // ZeroPadded sorts out left-padding when the fill is zero, to the right of sign:
    if (fillChar == u'0')
        flags |= QLocaleData::ZeroPadded;

    if (isAsciiUpper(format))
        flags |= QLocaleData::CapitalEorX;

    QLocaleData::DoubleForm form = QLocaleData::DFDecimal;
    switch (QtMiscUtils::toAsciiLower(format)) {
    case 'f':
        form = QLocaleData::DFDecimal;
        break;
    case 'e':
        form = QLocaleData::DFExponent;
        break;
    case 'g':
        form = QLocaleData::DFSignificantDigits;
        break;
    default:
#if defined(QT_CHECK_RANGE)
        qWarning("QString::arg: Invalid format char '%c'", format);
#endif
        break;
    }

    QString arg;
    if (d.occurrences > d.locale_occurrences) {
        arg = QLocaleData::c()->doubleToString(a, precision, form, fieldWidth,
                                               flags | QLocaleData::ZeroPadExponent);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= arg.size());
    }

    QString localeArg;
    if (d.locale_occurrences > 0) {
        QLocale locale;

        const QLocale::NumberOptions numberOptions = locale.numberOptions();
        if (!(numberOptions & QLocale::OmitGroupSeparator))
            flags |= QLocaleData::GroupDigits;
        if (!(numberOptions & QLocale::OmitLeadingZeroInExponent))
            flags |= QLocaleData::ZeroPadExponent;
        if (numberOptions & QLocale::IncludeTrailingZeroesAfterDot)
            flags |= QLocaleData::AddTrailingZeroes;
        localeArg = locale.d->m_data->doubleToString(a, precision, form, fieldWidth, flags);
        Q_ASSERT(fillChar != u'0' || !qt_is_finite(a)
                 || fieldWidth <= localeArg.size());
    }

    return replaceArgEscapes(*this, d, fieldWidth, arg, localeArg, fillChar);
}